

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

void VELOCYPACK_XXH3_generateSecret(void *secretBuffer,void *customSeed,size_t customSeedSize)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  size_t __n;
  long lVar4;
  XXH128_hash_t XVar5;
  XXH128_canonical_t scrambler;
  XXH64_hash_t seeds [12];
  ulong local_98;
  ulong uStack_90;
  long local_88 [12];
  
  if (customSeedSize != 0) {
    XVar5 = XXH3_128bits_internal
                      (customSeed,customSeedSize,0,XXH3_kSecret,0xc0,XXH3_hashLong_128b_withSeed);
    uVar2 = XVar5.high64;
    uVar1 = XVar5.low64;
    local_98 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uStack_90 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                uVar1 << 0x38;
    __n = 0x60;
    if (customSeedSize < 0x60) {
      __n = customSeedSize;
    }
    memcpy(local_88,customSeed,__n);
    if (customSeedSize < 0x60) {
      do {
        uVar1 = 0x60 - __n;
        if (__n < 0x60 - __n) {
          uVar1 = __n;
        }
        memcpy((void *)((long)local_88 + __n),local_88,uVar1);
        __n = __n + uVar1;
      } while (__n < 0x60);
    }
    *(ulong *)secretBuffer = local_98;
    *(ulong *)((long)secretBuffer + 8) = uStack_90;
    puVar3 = (ulong *)((long)secretBuffer + 0x18);
    lVar4 = 1;
    do {
      XVar5 = XXH3_128bits_internal
                        (&local_98,0x10,local_88[lVar4] + lVar4,XXH3_kSecret,0xc0,
                         XXH3_hashLong_128b_withSeed);
      uVar2 = XVar5.high64;
      uVar1 = XVar5.low64;
      puVar3[-1] = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                   (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                   (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                   | uVar2 << 0x38;
      *puVar3 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                uVar1 << 0x38;
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + 2;
    } while (lVar4 != 0xc);
    return;
  }
  memcpy(secretBuffer,XXH3_kSecret,0xc0);
  return;
}

Assistant:

XXH_PUBLIC_API void XXH3_generateSecret(void* secretBuffer,
                                        const void* customSeed,
                                        size_t customSeedSize) {
  XXH_ASSERT(secretBuffer != NULL);
  if (customSeedSize == 0) {
    memcpy(secretBuffer, XXH3_kSecret, XXH_SECRET_DEFAULT_SIZE);
    return;
  }
  XXH_ASSERT(customSeed != NULL);

  {
    size_t const segmentSize = sizeof(XXH128_hash_t);
    size_t const nbSegments = XXH_SECRET_DEFAULT_SIZE / segmentSize;
    XXH128_canonical_t scrambler;
    XXH64_hash_t seeds[12];
    size_t segnb;
    XXH_ASSERT(nbSegments == 12);
    XXH_ASSERT(segmentSize * nbSegments ==
               XXH_SECRET_DEFAULT_SIZE); /* exact multiple */
    XXH128_canonicalFromHash(&scrambler, XXH128(customSeed, customSeedSize, 0));

    /*
     * Copy customSeed to seeds[], truncating or repeating as necessary.
     */
    {
      size_t toFill = XXH_MIN(customSeedSize, sizeof(seeds));
      size_t filled = toFill;
      memcpy(seeds, customSeed, toFill);
      while (filled < sizeof(seeds)) {
        toFill = XXH_MIN(filled, sizeof(seeds) - filled);
        memcpy((char*)seeds + filled, seeds, toFill);
        filled += toFill;
      }
    }

    /* generate secret */
    memcpy(secretBuffer, &scrambler, sizeof(scrambler));
    for (segnb = 1; segnb < nbSegments; segnb++) {
      size_t const segmentStart = segnb * segmentSize;
      XXH128_canonical_t segment;
      XXH128_canonicalFromHash(&segment,
                               XXH128(&scrambler, sizeof(scrambler),
                                      XXH_readLE64(seeds + segnb) + segnb));
      memcpy((char*)secretBuffer + segmentStart, &segment, sizeof(segment));
    }
  }
}